

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall AnalogConsumer::~AnalogConsumer(AnalogConsumer *this)

{
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__AnalogConsumer_0043aa70;
  HFParsingInfo::~HFParsingInfo(&this->args);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->temp_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&(this->prev_interleaved).super__Vector_base<short,_std::allocator<short>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->il_id_masks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  HFSubConsumer::~HFSubConsumer(&this->super_HFSubConsumer);
  return;
}

Assistant:

AnalogConsumer::~AnalogConsumer(){

}